

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

string * __thiscall
flatbuffers::python::PythonGenerator::GenIndents_abi_cxx11_
          (string *__return_storage_ptr__,PythonGenerator *this,int num)

{
  long lVar1;
  allocator<char> local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_1c;
  PythonGenerator *pPStack_18;
  int num_local;
  PythonGenerator *this_local;
  
  local_1c = num;
  pPStack_18 = this;
  this_local = (PythonGenerator *)__return_storage_ptr__;
  lVar1 = std::__cxx11::string::length();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,num * lVar1,' ',&local_41);
  std::operator+(__return_storage_ptr__,"\n",&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return __return_storage_ptr__;
}

Assistant:

std::string GenIndents(int num) const {
    return "\n" + std::string(num * Indent.length(), ' ');
  }